

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

optional<unsigned_int>
slang::parseInt<unsigned_int>(string_view name,string_view value,string *error)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type sVar2;
  __integer_from_chars_result_type<unsigned_int> _Var3;
  __integer_from_chars_result_type<unsigned_int> result;
  const_pointer end;
  uint val;
  undefined1 in_stack_000000d0 [16];
  undefined1 in_stack_000000e0 [16];
  uint *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe78;
  int __base;
  char *x;
  value<fmt::v11::context> *in_stack_fffffffffffffe80;
  value<fmt::v11::context> *this_00;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  undefined1 local_128 [40];
  basic_string_view<char,_std::char_traits<char>_> local_100;
  undefined1 local_f0 [16];
  _Optional_payload_base<unsigned_int> local_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  char *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  char *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_100);
  if (bVar1) {
    local_90 = local_128;
    local_a0 = "expected value for argument \'{}\'";
    local_98 = 0x20;
    local_a8 = local_f0;
    local_b8 = "expected value for argument \'{}\'";
    local_b0 = 0x20;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_8 = &local_c8;
    local_10 = local_d8;
    local_c8 = 0xd;
    local_c0 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000000e0,(format_args)in_stack_000000d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(in_stack_fffffffffffffe70);
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x346b04);
  }
  else {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::basic_string_view<char,_std::char_traits<char>_>::data(&local_100);
    __base = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_100);
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(((_Optional_payload<unsigned_int,_true,_true,_true> *)&(this->_M_dataplus)._M_p
                     )->super__Optional_payload_base<unsigned_int>)._M_payload + sVar2);
    std::basic_string_view<char,_std::char_traits<char>_>::data(&local_100);
    _Var3 = std::from_chars<unsigned_int>
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                       (uint *)in_stack_fffffffffffffe80,__base);
    if ((_Var3.ec == 0) &&
       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var3.ptr == __str)) {
      std::optional<unsigned_int>::optional<unsigned_int,_true>
                ((optional<unsigned_int> *)this,in_stack_fffffffffffffe68);
    }
    else {
      x = "invalid value \'{}\' for integer argument \'{}\'";
      this_00 = (value<fmt::v11::context> *)0x2c;
      local_28 = &stack0xfffffffffffffe88;
      local_38 = "invalid value \'{}\' for integer argument \'{}\'";
      local_30 = 0x2c;
      local_40 = &local_100;
      local_48 = local_f0;
      local_58 = "invalid value \'{}\' for integer argument \'{}\'";
      local_50 = 0x2c;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)0x2c,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 "invalid value \'{}\' for integer argument \'{}\'");
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                (this_00,(basic_string_view<char,_std::char_traits<char>_> *)x);
      local_18 = &local_68;
      local_20 = local_88;
      local_68 = 0xdd;
      local_60 = local_20;
      ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000000e0,(format_args)in_stack_000000d0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffec0,__str);
      std::__cxx11::string::~string(this);
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x346cb4);
    }
  }
  return (optional<unsigned_int>)local_e0;
}

Assistant:

static std::optional<T> parseInt(std::string_view name, std::string_view value,
                                 std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    T val;
    auto end = value.data() + value.size();
    auto result = std::from_chars(value.data(), end, val);
    if (result.ec != std::errc() || result.ptr != end) {
        error = fmt::format("invalid value '{}' for integer argument '{}'", value, name);
        return {};
    }

    return val;
}